

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketConnection.cpp
# Opt level: O0

ssize_t __thiscall
FIX::ThreadedSocketConnection::read
          (ThreadedSocketConnection *this,int __fd,void *__buf,size_t __nbytes)

{
  Session *this_00;
  SocketRecvFailed *pSVar1;
  undefined8 extraout_RAX;
  SocketRecvFailed *e;
  size_t local_40;
  ssize_t size;
  int local_28;
  socket_handle local_24;
  int result;
  pollfd pfd;
  int timeout;
  ThreadedSocketConnection *this_local;
  
  pfd.fd = 1000;
  local_24 = this->m_socket;
  result._0_2_ = 3;
  result._2_2_ = 0;
  unique0x1000018b = this;
  local_28 = poll((pollfd *)&stack0xffffffffffffffdc,1,1000);
  if (local_28 < 1) {
    if ((local_28 == 0) && (this->m_pSession != (Session *)0x0)) {
      this_00 = this->m_pSession;
      UtcTimeStamp::now();
      Session::next(this_00,(UtcTimeStamp *)&e);
      UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&e);
    }
    else if (local_28 < 0) {
      pSVar1 = (SocketRecvFailed *)__cxa_allocate_exception(0x50);
      SocketRecvFailed::SocketRecvFailed(pSVar1,(long)local_28);
      __cxa_throw(pSVar1,&SocketRecvFailed::typeinfo,SocketRecvFailed::~SocketRecvFailed);
    }
  }
  else {
    local_40 = socket_recv(this->m_socket,this->m_buffer,0x2000);
    if ((long)local_40 < 1) {
      pSVar1 = (SocketRecvFailed *)__cxa_allocate_exception(0x50);
      SocketRecvFailed::SocketRecvFailed(pSVar1,local_40);
      __cxa_throw(pSVar1,&SocketRecvFailed::typeinfo,SocketRecvFailed::~SocketRecvFailed);
    }
    Parser::addToStream(&this->m_parser,this->m_buffer,local_40);
  }
  processStream(this);
  return CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
}

Assistant:

bool ThreadedSocketConnection::read() {
#if _MSC_VER
  struct timeval timeout = {1, 0};
  fd_set readset = m_fds;
#else
  int timeout = 1000; // 1000ms = 1 second
  struct pollfd pfd = {m_socket, POLLIN | POLLPRI, 0};
#endif

  try {
    // Wait for input (1 second timeout)
#if _MSC_VER
    int result = select(0, &readset, 0, 0, &timeout);
#else
    int result = poll(&pfd, 1, timeout);
#endif

    if (result > 0) // Something to read
    {
      // We can read without blocking
      ssize_t size = socket_recv(m_socket, m_buffer, sizeof(m_buffer));
      if (size <= 0) {
        throw SocketRecvFailed(size);
      }
      m_parser.addToStream(m_buffer, size);
    } else if (result == 0 && m_pSession) // Timeout
    {
      m_pSession->next(UtcTimeStamp::now());
    } else if (result < 0) // Error
    {
      throw SocketRecvFailed(result);
    }

    processStream();
    return true;
  } catch (SocketRecvFailed &e) {
    if (m_disconnect) {
      return false;
    }

    if (m_pSession) {
      m_pSession->getLog()->onEvent(e.what());
      m_pSession->disconnect();
    } else {
      disconnect();
    }

    return false;
  }
}